

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void QConcatenable<QString>::appendTo(QString *a,QChar **out)

{
  qsizetype qVar1;
  QChar *__src;
  long *in_RSI;
  QString *in_RDI;
  qsizetype n;
  QString *this;
  
  qVar1 = QString::size(in_RDI);
  if (qVar1 != 0) {
    this = (QString *)*in_RSI;
    __src = QString::data(this);
    memcpy(this,__src,qVar1 << 1);
  }
  *in_RSI = qVar1 * 2 + *in_RSI;
  return;
}

Assistant:

static inline void appendTo(const QString &a, QChar *&out)
    {
        const qsizetype n = a.size();
        if (n)
            memcpy(out, a.data(), sizeof(QChar) * n);
        out += n;
    }